

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ForthScriptCpp.h
# Opt level: O2

void __thiscall cppforth::Forth::definePrimitive(Forth *this,char *name,Code code,bool setImmediate)

{
  char cVar1;
  pointer pDVar2;
  Definition *pDVar3;
  undefined7 in_register_00000009;
  size_type sVar4;
  string *__range2;
  char cVar5;
  char in_R8B;
  Definition local_70;
  
  local_70._9_7_ = in_register_00000009;
  local_70._8_1_ = setImmediate;
  local_70.name._M_dataplus._M_p = (pointer)&local_70.name.field_2;
  local_70.flags = 0;
  local_70.name._M_string_length = 0;
  local_70.name.field_2._M_local_buf[0] = '\0';
  local_70.numberInVector = 0;
  local_70.searchOrder = 0;
  local_70.FlagHidden = 2;
  local_70.FlagImmediate = 4;
  local_70.does = this->dataPointer;
  local_70.code = code;
  local_70.parameter = local_70.does;
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::assign
            (&local_70.name,name);
  for (sVar4 = 0; local_70.name._M_string_length != sVar4; sVar4 = sVar4 + 1) {
    cVar1 = local_70.name._M_dataplus._M_p[sVar4];
    cVar5 = cVar1 + -0x20;
    if (0x19 < (byte)(cVar1 + 0x9fU)) {
      cVar5 = cVar1;
    }
    local_70.name._M_dataplus._M_p[sVar4] = cVar5;
  }
  std::vector<cppforth::Forth::Definition,_std::allocator<cppforth::Forth::Definition>_>::
  emplace_back<cppforth::Forth::Definition>(&this->definitions,&local_70);
  pDVar3 = getDefinition(this,(int)(((long)(this->definitions).
                                           super__Vector_base<cppforth::Forth::Definition,_std::allocator<cppforth::Forth::Definition>_>
                                           ._M_impl.super__Vector_impl_data._M_finish -
                                    (long)(this->definitions).
                                          super__Vector_base<cppforth::Forth::Definition,_std::allocator<cppforth::Forth::Definition>_>
                                          ._M_impl.super__Vector_impl_data._M_start) / 0x50) - 1);
  pDVar2 = (this->definitions).
           super__Vector_base<cppforth::Forth::Definition,_std::allocator<cppforth::Forth::Definition>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  pDVar3->numberInVector =
       (int)(((long)pDVar2 -
             (long)(this->definitions).
                   super__Vector_base<cppforth::Forth::Definition,_std::allocator<cppforth::Forth::Definition>_>
                   ._M_impl.super__Vector_impl_data._M_start) / 0x50) - 1;
  pDVar3->searchOrder = this->searchOrderCurrent;
  if (in_R8B != '\0') {
    pDVar2[-1].flags = pDVar2[-1].flags | pDVar2[-1].FlagImmediate;
  }
  std::__cxx11::string::~string((string *)&local_70.name);
  return;
}

Assistant:

void definePrimitive(const char* name, Code code, bool setImmediate) {
			alignDataPointer();

			Definition defn;
			defn.code = code;
			defn.parameter = defn.does = AADDR(getDataPointer());
			defn.name = name;
			for (auto & c: defn.name) c = toupper_ascii(static_cast<unsigned char>(c));
			definitions.emplace_back(std::move(defn));
			auto lastDefinition=getDefinition(CELL(definitions.size()) - 1);
			lastDefinition->numberInVector = CELL(definitions.size()) - 1;
			lastDefinition->searchOrder=searchOrderCurrent;
			if (setImmediate) immediate();
		}